

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcWallStandardCase::IfcWallStandardCase(IfcWallStandardCase *this)

{
  IfcWallStandardCase *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcWall).field_0x168,"IfcWallStandardCase");
  IfcWall::IfcWall(&this->super_IfcWall,&PTR_construction_vtable_24__00fa2378);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallStandardCase,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallStandardCase,_0UL> *)
             &(this->super_IfcWall).super_IfcBuildingElement.field_0x158,
             &PTR_construction_vtable_24__00fa2500);
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
       = 0xfa2220;
  *(undefined8 *)&(this->super_IfcWall).field_0x168 = 0xfa2360;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0x88 = 0xfa2248;
  (this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xfa2270;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject
    .field_0xd0 = 0xfa2298;
  *(undefined8 *)
   &(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 =
       0xfa22c0;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x138 =
       0xfa22e8;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.super_IfcElement.field_0x148 =
       0xfa2310;
  *(undefined8 *)&(this->super_IfcWall).super_IfcBuildingElement.field_0x158 = 0xfa2338;
  return;
}

Assistant:

IfcWallStandardCase() : Object("IfcWallStandardCase") {}